

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string *this;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  int i;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  string local_120 [32];
  undefined1 local_100 [8];
  string s1;
  string s2;
  string name;
  string line;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  int local_38;
  int local_34;
  int count;
  
  local_100 = (undefined1  [8])&s1._M_string_length;
  s1._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length._0_1_ = 0;
  s1.field_2._8_8_ = &s2._M_string_length;
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length._0_1_ = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_100);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(s1.field_2._M_local_buf + 8));
  std::istream::operator>>((istream *)&std::cin,&local_38);
  std::istream::ignore();
  dVar7 = get_number((string *)local_100);
  dVar8 = get_number((string *)((long)&s1.field_2 + 8));
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)local_100);
  std::operator<<(poVar2,": ");
  dVar7 = (dVar7 * 3.141592653589793) / 180.0;
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,(string *)(s1.field_2._M_local_buf + 8));
  std::operator<<(poVar2,": ");
  dVar8 = (dVar8 * 3.141592653589793) / 180.0;
  poVar2 = std::ostream::_M_insert<double>(dVar8);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  s2.field_2._8_8_ = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  iVar1 = 0;
  this = (string *)(&name.field_2._M_allocated_capacity + 1);
  local_34 = 0;
  do {
    if (local_38 <= iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)(s2.field_2._M_local_buf + 8));
      local_34 = 0;
      std::endl<char,std::char_traits<char>>(poVar2);
      break;
    }
    name.field_2._8_8_ = &line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,6,(allocator_type *)local_120);
    lVar5 = 0;
    for (uVar4 = 0; uVar4 != 5; uVar4 = uVar4 + 1) {
      lVar3 = std::__cxx11::string::find((char)this,0x3b);
      if (lVar3 == -1) {
        bVar6 = 4 < uVar4;
        local_34 = -1;
        goto LAB_00102664;
      }
      std::__cxx11::string::substr((ulong)local_120,(ulong)this);
      std::__cxx11::string::operator=
                ((string *)((long)&((_Alloc_hider *)local_68)->_M_p + lVar5),local_120);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::substr((ulong)local_120,(ulong)this);
      std::__cxx11::string::operator=(this,local_120);
      std::__cxx11::string::~string(local_120);
      lVar5 = lVar5 + 0x20;
    }
    std::__cxx11::string::_M_assign((string *)((long)local_68 + 0xa0));
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)get_number((string *)((long)local_68 + 0x80));
    dVar9 = get_number((string *)((long)local_68 + 0xa0));
    dVar10 = (dVar9 * 3.141592653589793) / 180.0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((double)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage * 3.141592653589793)
                   / 180.0 - dVar7);
    dVar9 = cos((dVar7 + dVar10) * 0.5);
    dVar10 = dVar10 - dVar8;
    dVar9 = SQRT(dVar9 * (double)parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage *
                 dVar9 * (double)parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage +
                 dVar10 * dVar10) * 6371.0;
    bVar6 = true;
    if ((name._M_dataplus._M_p == (pointer)0x0) || (dVar9 < (double)line.field_2._8_8_)) {
      line.field_2._8_8_ = dVar9;
      std::__cxx11::string::_M_assign((string *)(s2.field_2._M_local_buf + 8));
    }
LAB_00102664:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::__cxx11::string::~string(this);
    iVar1 = iVar1 + 1;
  } while (bVar6);
  std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_100);
  return local_34;
}

Assistant:

int main()
{
        int count;
        std::string s1, s2;
        double longtitude, latitude;
        getline(cin, s1);
        getline(cin, s2);
        cin >> count;
        cin.ignore();

        longtitude = get_number(s1)*M_PI/180;
        latitude = get_number(s2)*M_PI/180;
        std::cerr << s1 << ": " << longtitude << ", " << s2 << ": " << latitude << ", " << count << std::endl;

        std::string name;
        double min_distance;
        for (int i = 0; i < count; i++)
        {
                std::string line;
                getline(cin, line);

                std::vector<std::string> parts(6);
                for (int i = 0; i < 6 - 1; i++)
                {
                    std::string::size_type pos = line.find(';');
                    if (pos == std::string::npos)
                    {
                        //std::cout << "Invalid format: " << line << std::endl;
                        return -1;
                    }
                    parts[i] = line.substr(0, pos);
                    line = line.substr(pos + 1);
                    //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
                }
                parts[5] = line;
                //std::cerr << "Part #5: " << parts[5] << std::endl;

                double _long = get_number(parts[4])*M_PI/180;
                double _lat = get_number(parts[5])*M_PI/180;
                double x = (_long - longtitude)*cos((_lat + longtitude)/2);
                double y = _lat - latitude;
                double distance = sqrt(x*x + y*y)*6371;

                if (name.empty()
                    || min_distance > distance)
                {
                    name = parts[1];
                    min_distance = distance;
                }
        }

        std::cout << name << std::endl;

        return 0;
}